

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SkeletonMeshBuilder.cpp
# Opt level: O3

void __thiscall Assimp::SkeletonMeshBuilder::CreateGeometry(SkeletonMeshBuilder *this,aiNode *pNode)

{
  pointer *ppaVar1;
  pointer *ppFVar2;
  vector<Assimp::SkeletonMeshBuilder::Face,_std::allocator<Assimp::SkeletonMeshBuilder::Face>_>
  *this_00;
  pointer *pppaVar3;
  aiMatrix4x4 *paVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  iterator __position;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  undefined4 uVar28;
  undefined4 uVar29;
  undefined4 uVar30;
  undefined4 uVar31;
  undefined8 uVar32;
  aiNode **ppaVar33;
  undefined4 uVar34;
  undefined4 uVar35;
  undefined4 uVar36;
  undefined4 uVar37;
  undefined4 uVar38;
  undefined4 uVar39;
  undefined4 uVar40;
  undefined4 uVar41;
  undefined4 uVar42;
  undefined4 uVar43;
  undefined4 uVar44;
  uint uVar45;
  aiNode *paVar46;
  aiMatrix4x4t<float> *paVar47;
  aiVertexWeight *paVar48;
  pointer paVar49;
  ulong uVar50;
  uint a_1;
  ulong uVar51;
  iterator iVar52;
  iterator iVar53;
  iterator iVar54;
  ulong uVar55;
  uint a;
  float fVar56;
  float fVar57;
  float fVar58;
  float fVar59;
  undefined4 uVar60;
  undefined4 uVar61;
  undefined4 uVar62;
  float fVar63;
  float fVar64;
  float fVar65;
  float fVar66;
  float fVar67;
  aiBone *bone;
  aiVector3D childpos;
  aiVector3t<float> local_148;
  undefined1 local_138 [56];
  aiNode **ppaStack_100;
  undefined1 local_f8 [8];
  float fStack_f0;
  float fStack_ec;
  undefined1 local_e8 [16];
  vector<Assimp::SkeletonMeshBuilder::Face,_std::allocator<Assimp::SkeletonMeshBuilder::Face>_>
  *local_d0;
  float local_c8;
  float fStack_c4;
  float fStack_c0;
  float fStack_bc;
  float local_b8;
  float fStack_b4;
  float fStack_b0;
  float fStack_ac;
  float local_a8;
  float fStack_a4;
  float fStack_a0;
  float fStack_9c;
  float local_98;
  float fStack_94;
  float fStack_90;
  float fStack_8c;
  ulong local_80;
  float local_78;
  float fStack_74;
  float fStack_70;
  float fStack_6c;
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  float local_48;
  float fStack_44;
  float fStack_40;
  float fStack_3c;
  
  iVar53._M_current =
       (this->mVertices).super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  uVar55 = ((long)iVar53._M_current -
            (long)(this->mVertices).
                  super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl
                  .super__Vector_impl_data._M_start >> 2) * -0x5555555555555555;
  uVar45 = pNode->mNumChildren;
  local_80 = uVar55;
  if ((uVar45 == 0) || (this->mKnobsOnly != false)) {
    fVar59 = (pNode->mTransformation).a4;
    fVar63 = (pNode->mTransformation).b4;
    fVar56 = (pNode->mTransformation).c4;
    local_138._0_4_ = SQRT(fVar56 * fVar56 + fVar59 * fVar59 + fVar63 * fVar63) * 0.18;
    _local_f8 = ZEXT416((uint)local_138._0_4_);
    local_138._0_4_ = -(float)local_138._0_4_;
    local_e8._4_4_ = 0x80000000;
    local_e8._0_4_ = local_138._0_4_;
    local_e8._8_4_ = 0x80000000;
    local_e8._12_4_ = 0x80000000;
    local_138._4_4_ = 0.0;
    local_138._8_4_ = 0.0;
    if (iVar53._M_current ==
        (this->mVertices).super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
      _M_realloc_insert<aiVector3t<float>>
                ((vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)this,iVar53,
                 (aiVector3t<float> *)local_138);
      iVar53._M_current =
           (this->mVertices).
           super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
           super__Vector_impl_data._M_finish;
    }
    else {
      (iVar53._M_current)->z = 0.0;
      (iVar53._M_current)->x = (float)(int)(ulong)(uint)local_138._0_4_;
      (iVar53._M_current)->y = (float)(int)((ulong)(uint)local_138._0_4_ >> 0x20);
      iVar53._M_current =
           (this->mVertices).
           super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
           super__Vector_impl_data._M_finish + 1;
      (this->mVertices).super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
      _M_impl.super__Vector_impl_data._M_finish = iVar53._M_current;
    }
    local_138._0_4_ = 0.0;
    local_138._4_4_ = local_f8._0_4_;
    local_138._8_4_ = 0.0;
    if (iVar53._M_current ==
        (this->mVertices).super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
      _M_realloc_insert<aiVector3t<float>>
                ((vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)this,iVar53,
                 (aiVector3t<float> *)local_138);
      iVar53._M_current =
           (this->mVertices).
           super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
           super__Vector_impl_data._M_finish;
    }
    else {
      (iVar53._M_current)->z = 0.0;
      (iVar53._M_current)->x = (float)(int)((ulong)(uint)local_f8._0_4_ << 0x20);
      (iVar53._M_current)->y = (float)(int)(((ulong)(uint)local_f8._0_4_ << 0x20) >> 0x20);
      iVar53._M_current =
           (this->mVertices).
           super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
           super__Vector_impl_data._M_finish + 1;
      (this->mVertices).super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
      _M_impl.super__Vector_impl_data._M_finish = iVar53._M_current;
    }
    local_138._0_4_ = 0.0;
    local_138._4_4_ = 0.0;
    local_138._8_4_ = local_e8._0_4_;
    if (iVar53._M_current ==
        (this->mVertices).super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
      _M_realloc_insert<aiVector3t<float>>
                ((vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)this,iVar53,
                 (aiVector3t<float> *)local_138);
      iVar53._M_current =
           (this->mVertices).
           super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
           super__Vector_impl_data._M_finish;
    }
    else {
      (iVar53._M_current)->z = (float)local_e8._0_4_;
      (iVar53._M_current)->x = 0.0;
      (iVar53._M_current)->y = 0.0;
      iVar53._M_current =
           (this->mVertices).
           super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
           super__Vector_impl_data._M_finish + 1;
      (this->mVertices).super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
      _M_impl.super__Vector_impl_data._M_finish = iVar53._M_current;
    }
    local_138._0_4_ = 0.0;
    local_138._4_4_ = local_f8._0_4_;
    local_138._8_4_ = 0.0;
    if (iVar53._M_current ==
        (this->mVertices).super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
      _M_realloc_insert<aiVector3t<float>>
                ((vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)this,iVar53,
                 (aiVector3t<float> *)local_138);
      iVar53._M_current =
           (this->mVertices).
           super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
           super__Vector_impl_data._M_finish;
    }
    else {
      (iVar53._M_current)->z = 0.0;
      (iVar53._M_current)->x = (float)(int)((ulong)(uint)local_f8._0_4_ << 0x20);
      (iVar53._M_current)->y = (float)(int)(((ulong)(uint)local_f8._0_4_ << 0x20) >> 0x20);
      iVar53._M_current =
           (this->mVertices).
           super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
           super__Vector_impl_data._M_finish + 1;
      (this->mVertices).super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
      _M_impl.super__Vector_impl_data._M_finish = iVar53._M_current;
    }
    local_138._0_4_ = local_f8._0_4_;
    local_138._4_4_ = 0.0;
    local_138._8_4_ = 0.0;
    if (iVar53._M_current ==
        (this->mVertices).super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
      _M_realloc_insert<aiVector3t<float>>
                ((vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)this,iVar53,
                 (aiVector3t<float> *)local_138);
      iVar53._M_current =
           (this->mVertices).
           super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
           super__Vector_impl_data._M_finish;
    }
    else {
      (iVar53._M_current)->z = 0.0;
      (iVar53._M_current)->x = (float)(int)(ulong)(uint)local_f8._0_4_;
      (iVar53._M_current)->y = (float)(int)((ulong)(uint)local_f8._0_4_ >> 0x20);
      iVar53._M_current =
           (this->mVertices).
           super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
           super__Vector_impl_data._M_finish + 1;
      (this->mVertices).super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
      _M_impl.super__Vector_impl_data._M_finish = iVar53._M_current;
    }
    local_138._0_4_ = 0.0;
    local_138._4_4_ = 0.0;
    local_138._8_4_ = local_e8._0_4_;
    if (iVar53._M_current ==
        (this->mVertices).super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
      _M_realloc_insert<aiVector3t<float>>
                ((vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)this,iVar53,
                 (aiVector3t<float> *)local_138);
      iVar53._M_current =
           (this->mVertices).
           super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
           super__Vector_impl_data._M_finish;
    }
    else {
      (iVar53._M_current)->z = (float)local_e8._0_4_;
      (iVar53._M_current)->x = 0.0;
      (iVar53._M_current)->y = 0.0;
      iVar53._M_current =
           (this->mVertices).
           super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
           super__Vector_impl_data._M_finish + 1;
      (this->mVertices).super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
      _M_impl.super__Vector_impl_data._M_finish = iVar53._M_current;
    }
    local_138._0_4_ = local_f8._0_4_;
    local_138._4_4_ = 0.0;
    local_138._8_4_ = 0.0;
    if (iVar53._M_current ==
        (this->mVertices).super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
      _M_realloc_insert<aiVector3t<float>>
                ((vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)this,iVar53,
                 (aiVector3t<float> *)local_138);
      iVar53._M_current =
           (this->mVertices).
           super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
           super__Vector_impl_data._M_finish;
    }
    else {
      (iVar53._M_current)->z = 0.0;
      (iVar53._M_current)->x = (float)(int)(ulong)(uint)local_f8._0_4_;
      (iVar53._M_current)->y = (float)(int)((ulong)(uint)local_f8._0_4_ >> 0x20);
      iVar53._M_current =
           (this->mVertices).
           super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
           super__Vector_impl_data._M_finish + 1;
      (this->mVertices).super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
      _M_impl.super__Vector_impl_data._M_finish = iVar53._M_current;
    }
    local_138._0_4_ = 0.0;
    local_138._4_4_ = local_e8._0_4_;
    local_138._8_4_ = 0.0;
    if (iVar53._M_current ==
        (this->mVertices).super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
      _M_realloc_insert<aiVector3t<float>>
                ((vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)this,iVar53,
                 (aiVector3t<float> *)local_138);
      iVar53._M_current =
           (this->mVertices).
           super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
           super__Vector_impl_data._M_finish;
    }
    else {
      (iVar53._M_current)->z = 0.0;
      (iVar53._M_current)->x = (float)(int)((ulong)(uint)local_e8._0_4_ << 0x20);
      (iVar53._M_current)->y = (float)(int)(((ulong)(uint)local_e8._0_4_ << 0x20) >> 0x20);
      iVar53._M_current =
           (this->mVertices).
           super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
           super__Vector_impl_data._M_finish + 1;
      (this->mVertices).super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
      _M_impl.super__Vector_impl_data._M_finish = iVar53._M_current;
    }
    local_138._0_4_ = 0.0;
    local_138._4_4_ = 0.0;
    local_138._8_4_ = local_e8._0_4_;
    if (iVar53._M_current ==
        (this->mVertices).super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
      _M_realloc_insert<aiVector3t<float>>
                ((vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)this,iVar53,
                 (aiVector3t<float> *)local_138);
      iVar53._M_current =
           (this->mVertices).
           super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
           super__Vector_impl_data._M_finish;
    }
    else {
      (iVar53._M_current)->z = (float)local_e8._0_4_;
      (iVar53._M_current)->x = 0.0;
      (iVar53._M_current)->y = 0.0;
      iVar53._M_current =
           (this->mVertices).
           super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
           super__Vector_impl_data._M_finish + 1;
      (this->mVertices).super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
      _M_impl.super__Vector_impl_data._M_finish = iVar53._M_current;
    }
    local_138._0_4_ = 0.0;
    local_138._4_4_ = local_e8._0_4_;
    local_138._8_4_ = 0.0;
    if (iVar53._M_current ==
        (this->mVertices).super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
      _M_realloc_insert<aiVector3t<float>>
                ((vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)this,iVar53,
                 (aiVector3t<float> *)local_138);
      iVar53._M_current =
           (this->mVertices).
           super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
           super__Vector_impl_data._M_finish;
    }
    else {
      (iVar53._M_current)->z = 0.0;
      (iVar53._M_current)->x = (float)(int)((ulong)(uint)local_e8._0_4_ << 0x20);
      (iVar53._M_current)->y = (float)(int)(((ulong)(uint)local_e8._0_4_ << 0x20) >> 0x20);
      iVar53._M_current =
           (this->mVertices).
           super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
           super__Vector_impl_data._M_finish + 1;
      (this->mVertices).super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
      _M_impl.super__Vector_impl_data._M_finish = iVar53._M_current;
    }
    local_138._0_4_ = local_e8._0_4_;
    local_138._4_4_ = 0.0;
    local_138._8_4_ = 0.0;
    if (iVar53._M_current ==
        (this->mVertices).super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
      _M_realloc_insert<aiVector3t<float>>
                ((vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)this,iVar53,
                 (aiVector3t<float> *)local_138);
      iVar53._M_current =
           (this->mVertices).
           super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
           super__Vector_impl_data._M_finish;
    }
    else {
      (iVar53._M_current)->z = 0.0;
      (iVar53._M_current)->x = (float)(int)(ulong)(uint)local_e8._0_4_;
      (iVar53._M_current)->y = (float)(int)((ulong)(uint)local_e8._0_4_ >> 0x20);
      iVar53._M_current =
           (this->mVertices).
           super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
           super__Vector_impl_data._M_finish + 1;
      (this->mVertices).super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
      _M_impl.super__Vector_impl_data._M_finish = iVar53._M_current;
    }
    local_138._0_4_ = 0.0;
    local_138._4_4_ = 0.0;
    local_138._8_4_ = local_e8._0_4_;
    if (iVar53._M_current ==
        (this->mVertices).super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
      _M_realloc_insert<aiVector3t<float>>
                ((vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)this,iVar53,
                 (aiVector3t<float> *)local_138);
      iVar53._M_current =
           (this->mVertices).
           super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
           super__Vector_impl_data._M_finish;
    }
    else {
      (iVar53._M_current)->z = (float)local_e8._0_4_;
      (iVar53._M_current)->x = 0.0;
      (iVar53._M_current)->y = 0.0;
      iVar53._M_current =
           (this->mVertices).
           super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
           super__Vector_impl_data._M_finish + 1;
      (this->mVertices).super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
      _M_impl.super__Vector_impl_data._M_finish = iVar53._M_current;
    }
    local_138._0_4_ = local_e8._0_4_;
    local_138._4_4_ = 0.0;
    local_138._8_4_ = 0.0;
    if (iVar53._M_current ==
        (this->mVertices).super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
      _M_realloc_insert<aiVector3t<float>>
                ((vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)this,iVar53,
                 (aiVector3t<float> *)local_138);
      iVar53._M_current =
           (this->mVertices).
           super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
           super__Vector_impl_data._M_finish;
    }
    else {
      (iVar53._M_current)->z = 0.0;
      (iVar53._M_current)->x = (float)(int)(ulong)(uint)local_e8._0_4_;
      (iVar53._M_current)->y = (float)(int)((ulong)(uint)local_e8._0_4_ >> 0x20);
      iVar53._M_current =
           (this->mVertices).
           super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
           super__Vector_impl_data._M_finish + 1;
      (this->mVertices).super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
      _M_impl.super__Vector_impl_data._M_finish = iVar53._M_current;
    }
    local_138._0_4_ = 0.0;
    local_138._4_4_ = 0.0;
    local_138._8_4_ = local_f8._0_4_;
    if (iVar53._M_current ==
        (this->mVertices).super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
      _M_realloc_insert<aiVector3t<float>>
                ((vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)this,iVar53,
                 (aiVector3t<float> *)local_138);
      iVar53._M_current =
           (this->mVertices).
           super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
           super__Vector_impl_data._M_finish;
    }
    else {
      (iVar53._M_current)->z = (float)local_f8._0_4_;
      (iVar53._M_current)->x = 0.0;
      (iVar53._M_current)->y = 0.0;
      iVar53._M_current =
           (this->mVertices).
           super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
           super__Vector_impl_data._M_finish + 1;
      (this->mVertices).super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
      _M_impl.super__Vector_impl_data._M_finish = iVar53._M_current;
    }
    local_138._0_4_ = 0.0;
    local_138._4_4_ = local_f8._0_4_;
    local_138._8_4_ = 0.0;
    if (iVar53._M_current ==
        (this->mVertices).super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
      _M_realloc_insert<aiVector3t<float>>
                ((vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)this,iVar53,
                 (aiVector3t<float> *)local_138);
      iVar53._M_current =
           (this->mVertices).
           super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
           super__Vector_impl_data._M_finish;
    }
    else {
      (iVar53._M_current)->z = 0.0;
      (iVar53._M_current)->x = (float)(int)((ulong)(uint)local_f8._0_4_ << 0x20);
      (iVar53._M_current)->y = (float)(int)(((ulong)(uint)local_f8._0_4_ << 0x20) >> 0x20);
      iVar53._M_current =
           (this->mVertices).
           super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
           super__Vector_impl_data._M_finish + 1;
      (this->mVertices).super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
      _M_impl.super__Vector_impl_data._M_finish = iVar53._M_current;
    }
    local_138._0_4_ = 0.0;
    local_138._4_4_ = local_f8._0_4_;
    local_138._8_4_ = 0.0;
    if (iVar53._M_current ==
        (this->mVertices).super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
      _M_realloc_insert<aiVector3t<float>>
                ((vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)this,iVar53,
                 (aiVector3t<float> *)local_138);
      iVar53._M_current =
           (this->mVertices).
           super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
           super__Vector_impl_data._M_finish;
    }
    else {
      (iVar53._M_current)->z = 0.0;
      (iVar53._M_current)->x = (float)(int)((ulong)(uint)local_f8._0_4_ << 0x20);
      (iVar53._M_current)->y = (float)(int)(((ulong)(uint)local_f8._0_4_ << 0x20) >> 0x20);
      iVar53._M_current =
           (this->mVertices).
           super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
           super__Vector_impl_data._M_finish + 1;
      (this->mVertices).super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
      _M_impl.super__Vector_impl_data._M_finish = iVar53._M_current;
    }
    local_138._0_4_ = 0.0;
    local_138._4_4_ = 0.0;
    local_138._8_4_ = local_f8._0_4_;
    if (iVar53._M_current ==
        (this->mVertices).super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
      _M_realloc_insert<aiVector3t<float>>
                ((vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)this,iVar53,
                 (aiVector3t<float> *)local_138);
      iVar53._M_current =
           (this->mVertices).
           super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
           super__Vector_impl_data._M_finish;
    }
    else {
      (iVar53._M_current)->z = (float)local_f8._0_4_;
      (iVar53._M_current)->x = 0.0;
      (iVar53._M_current)->y = 0.0;
      iVar53._M_current =
           (this->mVertices).
           super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
           super__Vector_impl_data._M_finish + 1;
      (this->mVertices).super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
      _M_impl.super__Vector_impl_data._M_finish = iVar53._M_current;
    }
    local_138._0_4_ = local_f8._0_4_;
    local_138._4_4_ = 0.0;
    local_138._8_4_ = 0.0;
    if (iVar53._M_current ==
        (this->mVertices).super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
      _M_realloc_insert<aiVector3t<float>>
                ((vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)this,iVar53,
                 (aiVector3t<float> *)local_138);
      iVar53._M_current =
           (this->mVertices).
           super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
           super__Vector_impl_data._M_finish;
    }
    else {
      (iVar53._M_current)->z = 0.0;
      (iVar53._M_current)->x = (float)(int)(ulong)(uint)local_f8._0_4_;
      (iVar53._M_current)->y = (float)(int)((ulong)(uint)local_f8._0_4_ >> 0x20);
      iVar53._M_current =
           (this->mVertices).
           super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
           super__Vector_impl_data._M_finish + 1;
      (this->mVertices).super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
      _M_impl.super__Vector_impl_data._M_finish = iVar53._M_current;
    }
    local_138._0_4_ = local_f8._0_4_;
    local_138._4_4_ = 0.0;
    local_138._8_4_ = 0.0;
    if (iVar53._M_current ==
        (this->mVertices).super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
      _M_realloc_insert<aiVector3t<float>>
                ((vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)this,iVar53,
                 (aiVector3t<float> *)local_138);
      iVar53._M_current =
           (this->mVertices).
           super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
           super__Vector_impl_data._M_finish;
    }
    else {
      (iVar53._M_current)->z = 0.0;
      (iVar53._M_current)->x = (float)(int)(ulong)(uint)local_f8._0_4_;
      (iVar53._M_current)->y = (float)(int)((ulong)(uint)local_f8._0_4_ >> 0x20);
      iVar53._M_current =
           (this->mVertices).
           super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
           super__Vector_impl_data._M_finish + 1;
      (this->mVertices).super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
      _M_impl.super__Vector_impl_data._M_finish = iVar53._M_current;
    }
    local_138._0_4_ = 0.0;
    local_138._4_4_ = 0.0;
    local_138._8_4_ = local_f8._0_4_;
    if (iVar53._M_current ==
        (this->mVertices).super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
      _M_realloc_insert<aiVector3t<float>>
                ((vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)this,iVar53,
                 (aiVector3t<float> *)local_138);
      iVar53._M_current =
           (this->mVertices).
           super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
           super__Vector_impl_data._M_finish;
    }
    else {
      (iVar53._M_current)->z = (float)local_f8._0_4_;
      (iVar53._M_current)->x = 0.0;
      (iVar53._M_current)->y = 0.0;
      iVar53._M_current =
           (this->mVertices).
           super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
           super__Vector_impl_data._M_finish + 1;
      (this->mVertices).super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
      _M_impl.super__Vector_impl_data._M_finish = iVar53._M_current;
    }
    local_138._0_4_ = 0.0;
    local_138._4_4_ = local_e8._0_4_;
    local_138._8_4_ = 0.0;
    if (iVar53._M_current ==
        (this->mVertices).super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
      _M_realloc_insert<aiVector3t<float>>
                ((vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)this,iVar53,
                 (aiVector3t<float> *)local_138);
      iVar53._M_current =
           (this->mVertices).
           super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
           super__Vector_impl_data._M_finish;
    }
    else {
      (iVar53._M_current)->z = 0.0;
      (iVar53._M_current)->x = (float)(int)((ulong)(uint)local_e8._0_4_ << 0x20);
      (iVar53._M_current)->y = (float)(int)(((ulong)(uint)local_e8._0_4_ << 0x20) >> 0x20);
      iVar53._M_current =
           (this->mVertices).
           super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
           super__Vector_impl_data._M_finish + 1;
      (this->mVertices).super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
      _M_impl.super__Vector_impl_data._M_finish = iVar53._M_current;
    }
    local_138._0_4_ = 0.0;
    local_138._4_4_ = local_e8._0_4_;
    local_138._8_4_ = 0.0;
    if (iVar53._M_current ==
        (this->mVertices).super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
      _M_realloc_insert<aiVector3t<float>>
                ((vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)this,iVar53,
                 (aiVector3t<float> *)local_138);
      iVar53._M_current =
           (this->mVertices).
           super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
           super__Vector_impl_data._M_finish;
    }
    else {
      (iVar53._M_current)->z = 0.0;
      (iVar53._M_current)->x = (float)(int)((ulong)(uint)local_e8._0_4_ << 0x20);
      (iVar53._M_current)->y = (float)(int)(((ulong)(uint)local_e8._0_4_ << 0x20) >> 0x20);
      iVar53._M_current =
           (this->mVertices).
           super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
           super__Vector_impl_data._M_finish + 1;
      (this->mVertices).super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
      _M_impl.super__Vector_impl_data._M_finish = iVar53._M_current;
    }
    local_138._0_4_ = 0.0;
    local_138._4_4_ = 0.0;
    local_138._8_4_ = local_f8._0_4_;
    if (iVar53._M_current ==
        (this->mVertices).super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
      _M_realloc_insert<aiVector3t<float>>
                ((vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)this,iVar53,
                 (aiVector3t<float> *)local_138);
      iVar53._M_current =
           (this->mVertices).
           super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
           super__Vector_impl_data._M_finish;
    }
    else {
      (iVar53._M_current)->z = (float)local_f8._0_4_;
      (iVar53._M_current)->x = 0.0;
      (iVar53._M_current)->y = 0.0;
      iVar53._M_current =
           (this->mVertices).
           super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
           super__Vector_impl_data._M_finish + 1;
      (this->mVertices).super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
      _M_impl.super__Vector_impl_data._M_finish = iVar53._M_current;
    }
    local_138._0_4_ = local_e8._0_4_;
    local_138._4_4_ = 0.0;
    local_138._8_4_ = 0.0;
    if (iVar53._M_current ==
        (this->mVertices).super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
      _M_realloc_insert<aiVector3t<float>>
                ((vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)this,iVar53,
                 (aiVector3t<float> *)local_138);
    }
    else {
      (iVar53._M_current)->z = 0.0;
      (iVar53._M_current)->x = (float)(int)(ulong)(uint)local_e8._0_4_;
      (iVar53._M_current)->y = (float)(int)((ulong)(uint)local_e8._0_4_ >> 0x20);
      ppaVar1 = &(this->mVertices).
                 super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
                 super__Vector_impl_data._M_finish;
      *ppaVar1 = *ppaVar1 + 1;
    }
    this_00 = &this->mFaces;
    fVar59 = (float)uVar55;
    local_138._4_4_ = (int)fVar59 + 1;
    local_138._8_4_ = (int)fVar59 + 2;
    iVar54._M_current =
         (this->mFaces).
         super__Vector_base<Assimp::SkeletonMeshBuilder::Face,_std::allocator<Assimp::SkeletonMeshBuilder::Face>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    if (iVar54._M_current ==
        (this->mFaces).
        super__Vector_base<Assimp::SkeletonMeshBuilder::Face,_std::allocator<Assimp::SkeletonMeshBuilder::Face>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      local_138._0_4_ = fVar59;
      std::
      vector<Assimp::SkeletonMeshBuilder::Face,_std::allocator<Assimp::SkeletonMeshBuilder::Face>_>
      ::_M_realloc_insert<Assimp::SkeletonMeshBuilder::Face>(this_00,iVar54,(Face *)local_138);
      iVar54._M_current =
           (this->mFaces).
           super__Vector_base<Assimp::SkeletonMeshBuilder::Face,_std::allocator<Assimp::SkeletonMeshBuilder::Face>_>
           ._M_impl.super__Vector_impl_data._M_finish;
    }
    else {
      (iVar54._M_current)->mIndices[2] = local_138._8_4_;
      *(ulong *)(iVar54._M_current)->mIndices = CONCAT44(local_138._4_4_,fVar59);
      iVar54._M_current =
           (this->mFaces).
           super__Vector_base<Assimp::SkeletonMeshBuilder::Face,_std::allocator<Assimp::SkeletonMeshBuilder::Face>_>
           ._M_impl.super__Vector_impl_data._M_finish + 1;
      (this->mFaces).
      super__Vector_base<Assimp::SkeletonMeshBuilder::Face,_std::allocator<Assimp::SkeletonMeshBuilder::Face>_>
      ._M_impl.super__Vector_impl_data._M_finish = iVar54._M_current;
    }
    local_138._0_4_ = (int)fVar59 + 3;
    local_138._4_4_ = (int)fVar59 + 4;
    local_138._8_4_ = (int)fVar59 + 5;
    if (iVar54._M_current ==
        (this->mFaces).
        super__Vector_base<Assimp::SkeletonMeshBuilder::Face,_std::allocator<Assimp::SkeletonMeshBuilder::Face>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::
      vector<Assimp::SkeletonMeshBuilder::Face,_std::allocator<Assimp::SkeletonMeshBuilder::Face>_>
      ::_M_realloc_insert<Assimp::SkeletonMeshBuilder::Face>(this_00,iVar54,(Face *)local_138);
      iVar54._M_current =
           (this->mFaces).
           super__Vector_base<Assimp::SkeletonMeshBuilder::Face,_std::allocator<Assimp::SkeletonMeshBuilder::Face>_>
           ._M_impl.super__Vector_impl_data._M_finish;
    }
    else {
      (iVar54._M_current)->mIndices[2] = local_138._8_4_;
      *(ulong *)(iVar54._M_current)->mIndices = CONCAT44(local_138._4_4_,local_138._0_4_);
      iVar54._M_current =
           (this->mFaces).
           super__Vector_base<Assimp::SkeletonMeshBuilder::Face,_std::allocator<Assimp::SkeletonMeshBuilder::Face>_>
           ._M_impl.super__Vector_impl_data._M_finish + 1;
      (this->mFaces).
      super__Vector_base<Assimp::SkeletonMeshBuilder::Face,_std::allocator<Assimp::SkeletonMeshBuilder::Face>_>
      ._M_impl.super__Vector_impl_data._M_finish = iVar54._M_current;
    }
    local_138._0_4_ = (int)fVar59 + 6;
    local_138._4_4_ = (int)fVar59 + 7;
    local_138._8_4_ = (int)fVar59 + 8;
    if (iVar54._M_current ==
        (this->mFaces).
        super__Vector_base<Assimp::SkeletonMeshBuilder::Face,_std::allocator<Assimp::SkeletonMeshBuilder::Face>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::
      vector<Assimp::SkeletonMeshBuilder::Face,_std::allocator<Assimp::SkeletonMeshBuilder::Face>_>
      ::_M_realloc_insert<Assimp::SkeletonMeshBuilder::Face>(this_00,iVar54,(Face *)local_138);
      iVar54._M_current =
           (this->mFaces).
           super__Vector_base<Assimp::SkeletonMeshBuilder::Face,_std::allocator<Assimp::SkeletonMeshBuilder::Face>_>
           ._M_impl.super__Vector_impl_data._M_finish;
    }
    else {
      (iVar54._M_current)->mIndices[2] = local_138._8_4_;
      *(ulong *)(iVar54._M_current)->mIndices = CONCAT44(local_138._4_4_,local_138._0_4_);
      iVar54._M_current =
           (this->mFaces).
           super__Vector_base<Assimp::SkeletonMeshBuilder::Face,_std::allocator<Assimp::SkeletonMeshBuilder::Face>_>
           ._M_impl.super__Vector_impl_data._M_finish + 1;
      (this->mFaces).
      super__Vector_base<Assimp::SkeletonMeshBuilder::Face,_std::allocator<Assimp::SkeletonMeshBuilder::Face>_>
      ._M_impl.super__Vector_impl_data._M_finish = iVar54._M_current;
    }
    local_138._0_4_ = (int)fVar59 + 9;
    local_138._4_4_ = (int)fVar59 + 10;
    local_138._8_4_ = (int)fVar59 + 0xb;
    if (iVar54._M_current ==
        (this->mFaces).
        super__Vector_base<Assimp::SkeletonMeshBuilder::Face,_std::allocator<Assimp::SkeletonMeshBuilder::Face>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::
      vector<Assimp::SkeletonMeshBuilder::Face,_std::allocator<Assimp::SkeletonMeshBuilder::Face>_>
      ::_M_realloc_insert<Assimp::SkeletonMeshBuilder::Face>(this_00,iVar54,(Face *)local_138);
      iVar54._M_current =
           (this->mFaces).
           super__Vector_base<Assimp::SkeletonMeshBuilder::Face,_std::allocator<Assimp::SkeletonMeshBuilder::Face>_>
           ._M_impl.super__Vector_impl_data._M_finish;
    }
    else {
      (iVar54._M_current)->mIndices[2] = local_138._8_4_;
      *(ulong *)(iVar54._M_current)->mIndices = CONCAT44(local_138._4_4_,local_138._0_4_);
      iVar54._M_current =
           (this->mFaces).
           super__Vector_base<Assimp::SkeletonMeshBuilder::Face,_std::allocator<Assimp::SkeletonMeshBuilder::Face>_>
           ._M_impl.super__Vector_impl_data._M_finish + 1;
      (this->mFaces).
      super__Vector_base<Assimp::SkeletonMeshBuilder::Face,_std::allocator<Assimp::SkeletonMeshBuilder::Face>_>
      ._M_impl.super__Vector_impl_data._M_finish = iVar54._M_current;
    }
    local_138._0_4_ = (int)fVar59 + 0xc;
    local_138._4_4_ = (int)fVar59 + 0xd;
    local_138._8_4_ = (int)fVar59 + 0xe;
    if (iVar54._M_current ==
        (this->mFaces).
        super__Vector_base<Assimp::SkeletonMeshBuilder::Face,_std::allocator<Assimp::SkeletonMeshBuilder::Face>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::
      vector<Assimp::SkeletonMeshBuilder::Face,_std::allocator<Assimp::SkeletonMeshBuilder::Face>_>
      ::_M_realloc_insert<Assimp::SkeletonMeshBuilder::Face>(this_00,iVar54,(Face *)local_138);
      iVar54._M_current =
           (this->mFaces).
           super__Vector_base<Assimp::SkeletonMeshBuilder::Face,_std::allocator<Assimp::SkeletonMeshBuilder::Face>_>
           ._M_impl.super__Vector_impl_data._M_finish;
    }
    else {
      (iVar54._M_current)->mIndices[2] = local_138._8_4_;
      *(ulong *)(iVar54._M_current)->mIndices = CONCAT44(local_138._4_4_,local_138._0_4_);
      iVar54._M_current =
           (this->mFaces).
           super__Vector_base<Assimp::SkeletonMeshBuilder::Face,_std::allocator<Assimp::SkeletonMeshBuilder::Face>_>
           ._M_impl.super__Vector_impl_data._M_finish + 1;
      (this->mFaces).
      super__Vector_base<Assimp::SkeletonMeshBuilder::Face,_std::allocator<Assimp::SkeletonMeshBuilder::Face>_>
      ._M_impl.super__Vector_impl_data._M_finish = iVar54._M_current;
    }
    local_138._0_4_ = (int)fVar59 + 0xf;
    local_138._4_4_ = (int)fVar59 + 0x10;
    local_138._8_4_ = (int)fVar59 + 0x11;
    if (iVar54._M_current ==
        (this->mFaces).
        super__Vector_base<Assimp::SkeletonMeshBuilder::Face,_std::allocator<Assimp::SkeletonMeshBuilder::Face>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::
      vector<Assimp::SkeletonMeshBuilder::Face,_std::allocator<Assimp::SkeletonMeshBuilder::Face>_>
      ::_M_realloc_insert<Assimp::SkeletonMeshBuilder::Face>(this_00,iVar54,(Face *)local_138);
      iVar54._M_current =
           (this->mFaces).
           super__Vector_base<Assimp::SkeletonMeshBuilder::Face,_std::allocator<Assimp::SkeletonMeshBuilder::Face>_>
           ._M_impl.super__Vector_impl_data._M_finish;
    }
    else {
      (iVar54._M_current)->mIndices[2] = local_138._8_4_;
      *(ulong *)(iVar54._M_current)->mIndices = CONCAT44(local_138._4_4_,local_138._0_4_);
      iVar54._M_current =
           (this->mFaces).
           super__Vector_base<Assimp::SkeletonMeshBuilder::Face,_std::allocator<Assimp::SkeletonMeshBuilder::Face>_>
           ._M_impl.super__Vector_impl_data._M_finish + 1;
      (this->mFaces).
      super__Vector_base<Assimp::SkeletonMeshBuilder::Face,_std::allocator<Assimp::SkeletonMeshBuilder::Face>_>
      ._M_impl.super__Vector_impl_data._M_finish = iVar54._M_current;
    }
    local_138._0_4_ = (int)fVar59 + 0x12;
    local_138._4_4_ = (int)fVar59 + 0x13;
    local_138._8_4_ = (int)fVar59 + 0x14;
    if (iVar54._M_current ==
        (this->mFaces).
        super__Vector_base<Assimp::SkeletonMeshBuilder::Face,_std::allocator<Assimp::SkeletonMeshBuilder::Face>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::
      vector<Assimp::SkeletonMeshBuilder::Face,_std::allocator<Assimp::SkeletonMeshBuilder::Face>_>
      ::_M_realloc_insert<Assimp::SkeletonMeshBuilder::Face>(this_00,iVar54,(Face *)local_138);
      iVar54._M_current =
           (this->mFaces).
           super__Vector_base<Assimp::SkeletonMeshBuilder::Face,_std::allocator<Assimp::SkeletonMeshBuilder::Face>_>
           ._M_impl.super__Vector_impl_data._M_finish;
    }
    else {
      (iVar54._M_current)->mIndices[2] = local_138._8_4_;
      *(ulong *)(iVar54._M_current)->mIndices = CONCAT44(local_138._4_4_,local_138._0_4_);
      iVar54._M_current =
           (this->mFaces).
           super__Vector_base<Assimp::SkeletonMeshBuilder::Face,_std::allocator<Assimp::SkeletonMeshBuilder::Face>_>
           ._M_impl.super__Vector_impl_data._M_finish + 1;
      (this->mFaces).
      super__Vector_base<Assimp::SkeletonMeshBuilder::Face,_std::allocator<Assimp::SkeletonMeshBuilder::Face>_>
      ._M_impl.super__Vector_impl_data._M_finish = iVar54._M_current;
    }
    local_138._0_4_ = (int)fVar59 + 0x15;
    local_138._4_4_ = (int)fVar59 + 0x16;
    local_138._8_4_ = (int)fVar59 + 0x17;
    if (iVar54._M_current ==
        (this->mFaces).
        super__Vector_base<Assimp::SkeletonMeshBuilder::Face,_std::allocator<Assimp::SkeletonMeshBuilder::Face>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::
      vector<Assimp::SkeletonMeshBuilder::Face,_std::allocator<Assimp::SkeletonMeshBuilder::Face>_>
      ::_M_realloc_insert<Assimp::SkeletonMeshBuilder::Face>(this_00,iVar54,(Face *)local_138);
    }
    else {
      (iVar54._M_current)->mIndices[2] = local_138._8_4_;
      *(ulong *)(iVar54._M_current)->mIndices = CONCAT44(local_138._4_4_,local_138._0_4_);
      ppFVar2 = &(this->mFaces).
                 super__Vector_base<Assimp::SkeletonMeshBuilder::Face,_std::allocator<Assimp::SkeletonMeshBuilder::Face>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      *ppFVar2 = *ppFVar2 + 1;
    }
  }
  else {
    local_d0 = &this->mFaces;
    uVar55 = 0;
    do {
      paVar46 = pNode->mChildren[uVar55];
      local_138._0_4_ = (paVar46->mTransformation).a4;
      local_138._4_4_ = (paVar46->mTransformation).b4;
      local_138._8_4_ = (paVar46->mTransformation).c4;
      fVar59 = SQRT((float)local_138._8_4_ * (float)local_138._8_4_ +
                    (float)local_138._0_4_ * (float)local_138._0_4_ +
                    (float)local_138._4_4_ * (float)local_138._4_4_);
      if (0.0001 <= fVar59) {
        fStack_bc = 1.0 / fVar59;
        local_f8._0_4_ = (float)local_138._4_4_ * fStack_bc;
        local_c8 = fStack_bc * (float)local_138._8_4_;
        fStack_c4 = fStack_bc * (float)local_138._0_4_;
        fStack_c0 = fStack_bc * 0.0;
        fStack_bc = fStack_bc * 0.0;
        uVar45 = (uint)(0.99 < ABS(local_c8 * 0.0 + fStack_c4 + (float)local_f8._0_4_ * 0.0));
        fVar56 = (float)(~((int)(uVar45 << 0x1f) >> 0x1f) & 0x3f800000);
        fVar64 = (float)((int)(uVar45 << 0x1f) >> 0x1f & 0x3f800000);
        fVar63 = (float)local_f8._0_4_ * 0.0 - fVar64 * local_c8;
        local_78 = fStack_c4 * -0.0 + local_c8 * fVar56;
        fStack_74 = fVar56 * -(float)local_f8._0_4_ + fStack_c4 * fVar64;
        fStack_6c = 1.0 / SQRT(fStack_74 * fStack_74 + fVar63 * fVar63 + local_78 * local_78);
        fVar63 = fVar63 * fStack_6c;
        local_78 = fStack_6c * local_78;
        fStack_74 = fStack_6c * fStack_74;
        fStack_70 = fStack_6c * (fStack_c0 * 0.0 + fStack_c0 * 0.0);
        fStack_6c = fStack_6c * (fStack_bc * -0.0 + fStack_bc * 0.0);
        local_68 = ZEXT416((uint)fVar63);
        fVar56 = -fVar63;
        iVar53._M_current =
             (this->mVertices).
             super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
             super__Vector_impl_data._M_finish;
        paVar49 = (this->mVertices).
                  super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl
                  .super__Vector_impl_data._M_start;
        local_48 = fVar56 * fVar59 * 0.1;
        fStack_44 = -local_78 * fVar59 * 0.1;
        fStack_40 = fVar56 * fVar59 * 0.0;
        fStack_3c = fVar56 * fVar59 * 0.0;
        local_148.z = fVar59 * -fStack_74 * 0.1;
        local_58 = ZEXT416((uint)local_148.z);
        local_148.y = fStack_44;
        local_148.x = local_48;
        local_e8 = ZEXT416((uint)fVar59);
        local_b8 = fVar59;
        fStack_b4 = fVar59;
        fStack_b0 = fVar59;
        fStack_ac = fVar59;
        if (iVar53._M_current ==
            (this->mVertices).
            super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          _local_f8 = ZEXT416((uint)local_f8._0_4_);
          local_a8 = fStack_74;
          fStack_a4 = fVar63;
          fStack_a0 = fStack_70;
          fStack_9c = fStack_6c;
          local_98 = fStack_c4;
          fStack_94 = fStack_c4;
          fStack_90 = fStack_c4;
          fStack_8c = fStack_c4;
          std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
          _M_realloc_insert<aiVector3t<float>>
                    ((vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)this,iVar53,
                     &local_148);
          iVar52._M_current =
               (this->mVertices).
               super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
               super__Vector_impl_data._M_finish;
          fVar59 = (float)local_e8._0_4_;
          uVar60 = local_e8._4_4_;
          uVar61 = local_e8._8_4_;
          uVar62 = local_e8._12_4_;
          fVar56 = local_a8;
          fVar63 = fStack_a4;
          fVar64 = fStack_a0;
          fVar65 = fStack_9c;
          fVar57 = local_98;
          fVar58 = fStack_94;
          fVar66 = fStack_90;
          fVar67 = fStack_8c;
        }
        else {
          (iVar53._M_current)->z = local_148.z;
          (iVar53._M_current)->x = local_48;
          (iVar53._M_current)->y = fStack_44;
          iVar52._M_current =
               (this->mVertices).
               super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
               super__Vector_impl_data._M_finish + 1;
          (this->mVertices).
          super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
          super__Vector_impl_data._M_finish = iVar52._M_current;
          local_f8._4_4_ = 0.0;
          fStack_f0 = 0.0;
          fStack_ec = 0.0;
          uVar60 = 0;
          uVar61 = 0;
          uVar62 = 0;
          fVar56 = fStack_74;
          fVar64 = fStack_70;
          fVar65 = fStack_6c;
          fVar57 = fStack_c4;
          fVar58 = fStack_c4;
          fVar66 = fStack_c4;
          fVar67 = fStack_c4;
        }
        if (iVar52._M_current ==
            (this->mVertices).
            super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          local_a8 = fVar56;
          fStack_a4 = fVar63;
          fStack_a0 = fVar64;
          fStack_9c = fVar65;
          local_98 = fVar57;
          fStack_94 = fVar58;
          fStack_90 = fVar66;
          fStack_8c = fVar67;
          std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
          _M_realloc_insert<aiVector3t<float>const&>
                    ((vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)this,iVar52,
                     (aiVector3t<float> *)local_138);
          iVar52._M_current =
               (this->mVertices).
               super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
               super__Vector_impl_data._M_finish;
          fVar59 = (float)local_e8._0_4_;
          uVar60 = local_e8._4_4_;
          uVar61 = local_e8._8_4_;
          uVar62 = local_e8._12_4_;
          fVar56 = local_a8;
          fVar63 = fStack_a4;
          fVar64 = fStack_a0;
          fVar65 = fStack_9c;
          fVar57 = local_98;
        }
        else {
          (iVar52._M_current)->z = (float)local_138._8_4_;
          (iVar52._M_current)->x = (float)local_138._0_4_;
          (iVar52._M_current)->y = (float)local_138._4_4_;
          iVar52._M_current =
               (this->mVertices).
               super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
               super__Vector_impl_data._M_finish + 1;
          (this->mVertices).
          super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
          super__Vector_impl_data._M_finish = iVar52._M_current;
        }
        fVar64 = local_c8 * fVar64;
        fVar65 = local_c8 * fVar65;
        fVar56 = local_78 * local_c8 - (float)local_f8._0_4_ * fVar56;
        fVar63 = fStack_74 * fStack_c4 - local_c8 * fVar63;
        fVar58 = (float)local_f8._0_4_ * (float)local_68._0_4_ - fVar57 * local_78;
        fVar57 = 1.0 / SQRT(fVar58 * fVar58 + fVar56 * fVar56 + fVar63 * fVar63);
        local_f8._0_4_ = fVar58 * fVar57 * fVar59;
        local_c8 = fVar57 * fVar56 * local_b8;
        fStack_c4 = fVar57 * fVar63 * fStack_b4;
        fStack_c0 = fVar57 * (fStack_70 * fStack_c0 - fVar64) * fStack_b0;
        fStack_bc = fVar57 * (fStack_6c * fStack_bc - fVar65) * fStack_ac;
        local_148.x = local_c8 * -0.1;
        local_148.y = fStack_c4 * -0.1;
        local_148.z = (float)local_f8._0_4_ * -0.1;
        if (iVar52._M_current ==
            (this->mVertices).
            super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          local_a8 = local_148.z;
          fStack_a4 = (float)local_f8._4_4_;
          fStack_a0 = fStack_f0;
          fStack_9c = fStack_ec;
          local_98 = local_148.x;
          fStack_94 = local_148.y;
          fStack_90 = fStack_c0 * 0.0;
          fStack_8c = fStack_bc * 0.0;
          std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
          _M_realloc_insert<aiVector3t<float>>
                    ((vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)this,iVar52,
                     &local_148);
          iVar52._M_current =
               (this->mVertices).
               super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
               super__Vector_impl_data._M_finish;
          local_148.z = local_a8;
          fVar63 = (float)local_f8._0_4_;
          fVar56 = (float)local_f8._4_4_;
          fVar64 = fStack_f0;
          fVar65 = fStack_ec;
          fVar59 = (float)local_e8._0_4_;
          uVar60 = local_e8._4_4_;
          uVar61 = local_e8._8_4_;
          uVar62 = local_e8._12_4_;
          local_148.x = local_98;
          local_148.y = fStack_94;
        }
        else {
          (iVar52._M_current)->z = local_148.z;
          (iVar52._M_current)->x = local_148.x;
          (iVar52._M_current)->y = local_148.y;
          iVar52._M_current =
               (this->mVertices).
               super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
               super__Vector_impl_data._M_finish + 1;
          (this->mVertices).
          super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
          super__Vector_impl_data._M_finish = iVar52._M_current;
          fVar63 = (float)local_f8._0_4_;
          fVar56 = (float)local_f8._4_4_;
          fVar64 = fStack_f0;
          fVar65 = fStack_ec;
        }
        if (iVar52._M_current ==
            (this->mVertices).
            super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
          _M_realloc_insert<aiVector3t<float>>
                    ((vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)this,iVar52,
                     &local_148);
          iVar52._M_current =
               (this->mVertices).
               super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
               super__Vector_impl_data._M_finish;
          fVar63 = (float)local_f8._0_4_;
          fVar56 = (float)local_f8._4_4_;
          fVar64 = fStack_f0;
          fVar65 = fStack_ec;
          fVar59 = (float)local_e8._0_4_;
          uVar60 = local_e8._4_4_;
          uVar61 = local_e8._8_4_;
          uVar62 = local_e8._12_4_;
        }
        else {
          (iVar52._M_current)->z = local_148.z;
          (iVar52._M_current)->x = local_148.x;
          (iVar52._M_current)->y = local_148.y;
          iVar52._M_current =
               (this->mVertices).
               super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
               super__Vector_impl_data._M_finish + 1;
          (this->mVertices).
          super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
          super__Vector_impl_data._M_finish = iVar52._M_current;
        }
        if (iVar52._M_current ==
            (this->mVertices).
            super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
          _M_realloc_insert<aiVector3t<float>const&>
                    ((vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)this,iVar52,
                     (aiVector3t<float> *)local_138);
          iVar52._M_current =
               (this->mVertices).
               super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
               super__Vector_impl_data._M_finish;
          fVar63 = (float)local_f8._0_4_;
          fVar56 = (float)local_f8._4_4_;
          fVar64 = fStack_f0;
          fVar65 = fStack_ec;
          fVar59 = (float)local_e8._0_4_;
          uVar60 = local_e8._4_4_;
          uVar61 = local_e8._8_4_;
          uVar62 = local_e8._12_4_;
        }
        else {
          (iVar52._M_current)->z = (float)local_138._8_4_;
          (iVar52._M_current)->x = (float)local_138._0_4_;
          (iVar52._M_current)->y = (float)local_138._4_4_;
          iVar52._M_current =
               (this->mVertices).
               super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
               super__Vector_impl_data._M_finish + 1;
          (this->mVertices).
          super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
          super__Vector_impl_data._M_finish = iVar52._M_current;
        }
        local_148.x = local_b8 * (float)local_68._0_4_ * 0.1;
        local_148.y = fStack_b4 * local_78 * 0.1;
        local_148.z = fVar59 * fStack_74 * 0.1;
        if (iVar52._M_current ==
            (this->mVertices).
            super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          local_e8._4_4_ = uVar60;
          local_e8._0_4_ = local_148.z;
          local_e8._8_4_ = uVar61;
          local_e8._12_4_ = uVar62;
          local_b8 = local_148.x;
          fStack_b4 = local_148.y;
          fStack_b0 = fStack_b0 * fStack_70 * 0.0;
          fStack_ac = fStack_ac * fStack_6c * 0.0;
          std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
          _M_realloc_insert<aiVector3t<float>>
                    ((vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)this,iVar52,
                     &local_148);
          iVar52._M_current =
               (this->mVertices).
               super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
               super__Vector_impl_data._M_finish;
          fVar63 = (float)local_f8._0_4_;
          fVar56 = (float)local_f8._4_4_;
          fVar64 = fStack_f0;
          fVar65 = fStack_ec;
          local_148.z = (float)local_e8._0_4_;
          local_148.x = local_b8;
          local_148.y = fStack_b4;
        }
        else {
          (iVar52._M_current)->z = local_148.z;
          (iVar52._M_current)->x = local_148.x;
          (iVar52._M_current)->y = local_148.y;
          iVar52._M_current =
               (this->mVertices).
               super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
               super__Vector_impl_data._M_finish + 1;
          (this->mVertices).
          super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
          super__Vector_impl_data._M_finish = iVar52._M_current;
        }
        if (iVar52._M_current ==
            (this->mVertices).
            super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
          _M_realloc_insert<aiVector3t<float>>
                    ((vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)this,iVar52,
                     &local_148);
          iVar52._M_current =
               (this->mVertices).
               super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
               super__Vector_impl_data._M_finish;
          fVar63 = (float)local_f8._0_4_;
          fVar56 = (float)local_f8._4_4_;
          fVar64 = fStack_f0;
          fVar65 = fStack_ec;
        }
        else {
          (iVar52._M_current)->z = local_148.z;
          (iVar52._M_current)->x = local_148.x;
          (iVar52._M_current)->y = local_148.y;
          iVar52._M_current =
               (this->mVertices).
               super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
               super__Vector_impl_data._M_finish + 1;
          (this->mVertices).
          super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
          super__Vector_impl_data._M_finish = iVar52._M_current;
        }
        if (iVar52._M_current ==
            (this->mVertices).
            super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
          _M_realloc_insert<aiVector3t<float>const&>
                    ((vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)this,iVar52,
                     (aiVector3t<float> *)local_138);
          iVar52._M_current =
               (this->mVertices).
               super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
               super__Vector_impl_data._M_finish;
          fVar63 = (float)local_f8._0_4_;
          fVar56 = (float)local_f8._4_4_;
          fVar64 = fStack_f0;
          fVar65 = fStack_ec;
        }
        else {
          (iVar52._M_current)->z = (float)local_138._8_4_;
          (iVar52._M_current)->x = (float)local_138._0_4_;
          (iVar52._M_current)->y = (float)local_138._4_4_;
          iVar52._M_current =
               (this->mVertices).
               super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
               super__Vector_impl_data._M_finish + 1;
          (this->mVertices).
          super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
          super__Vector_impl_data._M_finish = iVar52._M_current;
        }
        fVar59 = local_c8 * 0.1;
        fVar57 = fStack_c4 * 0.1;
        local_148.z = fVar63 * 0.1;
        local_148._0_8_ = CONCAT44(fVar57,fVar59);
        if (iVar52._M_current ==
            (this->mVertices).
            super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          local_f8._4_4_ = fVar56;
          local_f8._0_4_ = local_148.z;
          fStack_f0 = fVar64;
          fStack_ec = fVar65;
          local_c8 = fVar59;
          fStack_c4 = fVar57;
          fStack_c0 = fStack_c0 * 0.0;
          fStack_bc = fStack_bc * 0.0;
          std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
          _M_realloc_insert<aiVector3t<float>>
                    ((vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)this,iVar52,
                     &local_148);
          iVar52._M_current =
               (this->mVertices).
               super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
               super__Vector_impl_data._M_finish;
          fVar59 = local_c8;
          fVar57 = fStack_c4;
          local_148.z = (float)local_f8._0_4_;
        }
        else {
          (iVar52._M_current)->z = local_148.z;
          *(undefined8 *)iVar52._M_current = local_148._0_8_;
          iVar52._M_current =
               (this->mVertices).
               super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
               super__Vector_impl_data._M_finish + 1;
          (this->mVertices).
          super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
          super__Vector_impl_data._M_finish = iVar52._M_current;
        }
        local_148._0_8_ = CONCAT44(fVar57,fVar59);
        if (iVar52._M_current ==
            (this->mVertices).
            super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
          _M_realloc_insert<aiVector3t<float>>
                    ((vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)this,iVar52,
                     &local_148);
          iVar52._M_current =
               (this->mVertices).
               super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
               super__Vector_impl_data._M_finish;
        }
        else {
          (iVar52._M_current)->z = local_148.z;
          *(undefined8 *)iVar52._M_current = local_148._0_8_;
          iVar52._M_current =
               (this->mVertices).
               super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
               super__Vector_impl_data._M_finish + 1;
          (this->mVertices).
          super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
          super__Vector_impl_data._M_finish = iVar52._M_current;
        }
        if (iVar52._M_current ==
            (this->mVertices).
            super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
          _M_realloc_insert<aiVector3t<float>const&>
                    ((vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)this,iVar52,
                     (aiVector3t<float> *)local_138);
          iVar52._M_current =
               (this->mVertices).
               super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
               super__Vector_impl_data._M_finish;
        }
        else {
          (iVar52._M_current)->z = (float)local_138._8_4_;
          (iVar52._M_current)->x = (float)local_138._0_4_;
          (iVar52._M_current)->y = (float)local_138._4_4_;
          iVar52._M_current =
               (this->mVertices).
               super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
               super__Vector_impl_data._M_finish + 1;
          (this->mVertices).
          super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
          super__Vector_impl_data._M_finish = iVar52._M_current;
        }
        local_148._0_8_ = CONCAT44(fStack_44,local_48);
        local_148.z = (float)local_58._0_4_;
        if (iVar52._M_current ==
            (this->mVertices).
            super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
          _M_realloc_insert<aiVector3t<float>>
                    ((vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)this,iVar52,
                     &local_148);
        }
        else {
          (iVar52._M_current)->z = (float)local_58._0_4_;
          *(undefined8 *)iVar52._M_current = local_148._0_8_;
          ppaVar1 = &(this->mVertices).
                     super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                     _M_impl.super__Vector_impl_data._M_finish;
          *ppaVar1 = *ppaVar1 + 1;
        }
        fVar59 = (float)((int)((ulong)((long)iVar53._M_current - (long)paVar49) >> 2) * -0x55555555)
        ;
        local_148.z = (float)((int)fVar59 + 2);
        local_148.y = (float)((int)fVar59 + 1);
        local_148.x = fVar59;
        iVar54._M_current =
             (this->mFaces).
             super__Vector_base<Assimp::SkeletonMeshBuilder::Face,_std::allocator<Assimp::SkeletonMeshBuilder::Face>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        if (iVar54._M_current ==
            (this->mFaces).
            super__Vector_base<Assimp::SkeletonMeshBuilder::Face,_std::allocator<Assimp::SkeletonMeshBuilder::Face>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::
          vector<Assimp::SkeletonMeshBuilder::Face,_std::allocator<Assimp::SkeletonMeshBuilder::Face>_>
          ::_M_realloc_insert<Assimp::SkeletonMeshBuilder::Face>(local_d0,iVar54,(Face *)&local_148)
          ;
          iVar54._M_current =
               (this->mFaces).
               super__Vector_base<Assimp::SkeletonMeshBuilder::Face,_std::allocator<Assimp::SkeletonMeshBuilder::Face>_>
               ._M_impl.super__Vector_impl_data._M_finish;
        }
        else {
          (iVar54._M_current)->mIndices[2] = (uint)local_148.z;
          (iVar54._M_current)->mIndices[0] = (uint)fVar59;
          (iVar54._M_current)->mIndices[1] = (int)fVar59 + 1;
          iVar54._M_current =
               (this->mFaces).
               super__Vector_base<Assimp::SkeletonMeshBuilder::Face,_std::allocator<Assimp::SkeletonMeshBuilder::Face>_>
               ._M_impl.super__Vector_impl_data._M_finish + 1;
          (this->mFaces).
          super__Vector_base<Assimp::SkeletonMeshBuilder::Face,_std::allocator<Assimp::SkeletonMeshBuilder::Face>_>
          ._M_impl.super__Vector_impl_data._M_finish = iVar54._M_current;
        }
        local_148.z = (float)((int)fVar59 + 5);
        local_148.y = (float)((int)fVar59 + 4);
        local_148.x = (float)((int)fVar59 + 3);
        if (iVar54._M_current ==
            (this->mFaces).
            super__Vector_base<Assimp::SkeletonMeshBuilder::Face,_std::allocator<Assimp::SkeletonMeshBuilder::Face>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::
          vector<Assimp::SkeletonMeshBuilder::Face,_std::allocator<Assimp::SkeletonMeshBuilder::Face>_>
          ::_M_realloc_insert<Assimp::SkeletonMeshBuilder::Face>(local_d0,iVar54,(Face *)&local_148)
          ;
          iVar54._M_current =
               (this->mFaces).
               super__Vector_base<Assimp::SkeletonMeshBuilder::Face,_std::allocator<Assimp::SkeletonMeshBuilder::Face>_>
               ._M_impl.super__Vector_impl_data._M_finish;
        }
        else {
          (iVar54._M_current)->mIndices[2] = (uint)local_148.z;
          (iVar54._M_current)->mIndices[0] = (int)fVar59 + 3;
          (iVar54._M_current)->mIndices[1] = (int)fVar59 + 4;
          iVar54._M_current =
               (this->mFaces).
               super__Vector_base<Assimp::SkeletonMeshBuilder::Face,_std::allocator<Assimp::SkeletonMeshBuilder::Face>_>
               ._M_impl.super__Vector_impl_data._M_finish + 1;
          (this->mFaces).
          super__Vector_base<Assimp::SkeletonMeshBuilder::Face,_std::allocator<Assimp::SkeletonMeshBuilder::Face>_>
          ._M_impl.super__Vector_impl_data._M_finish = iVar54._M_current;
        }
        local_148.z = (float)((int)fVar59 + 8);
        local_148.y = (float)((int)fVar59 + 7);
        local_148.x = (float)((int)fVar59 + 6);
        if (iVar54._M_current ==
            (this->mFaces).
            super__Vector_base<Assimp::SkeletonMeshBuilder::Face,_std::allocator<Assimp::SkeletonMeshBuilder::Face>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::
          vector<Assimp::SkeletonMeshBuilder::Face,_std::allocator<Assimp::SkeletonMeshBuilder::Face>_>
          ::_M_realloc_insert<Assimp::SkeletonMeshBuilder::Face>(local_d0,iVar54,(Face *)&local_148)
          ;
          iVar54._M_current =
               (this->mFaces).
               super__Vector_base<Assimp::SkeletonMeshBuilder::Face,_std::allocator<Assimp::SkeletonMeshBuilder::Face>_>
               ._M_impl.super__Vector_impl_data._M_finish;
        }
        else {
          (iVar54._M_current)->mIndices[2] = (uint)local_148.z;
          (iVar54._M_current)->mIndices[0] = (int)fVar59 + 6;
          (iVar54._M_current)->mIndices[1] = (int)fVar59 + 7;
          iVar54._M_current =
               (this->mFaces).
               super__Vector_base<Assimp::SkeletonMeshBuilder::Face,_std::allocator<Assimp::SkeletonMeshBuilder::Face>_>
               ._M_impl.super__Vector_impl_data._M_finish + 1;
          (this->mFaces).
          super__Vector_base<Assimp::SkeletonMeshBuilder::Face,_std::allocator<Assimp::SkeletonMeshBuilder::Face>_>
          ._M_impl.super__Vector_impl_data._M_finish = iVar54._M_current;
        }
        local_148.z = (float)((int)fVar59 + 0xb);
        local_148.y = (float)((int)fVar59 + 10);
        local_148.x = (float)((int)fVar59 + 9);
        if (iVar54._M_current ==
            (this->mFaces).
            super__Vector_base<Assimp::SkeletonMeshBuilder::Face,_std::allocator<Assimp::SkeletonMeshBuilder::Face>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::
          vector<Assimp::SkeletonMeshBuilder::Face,_std::allocator<Assimp::SkeletonMeshBuilder::Face>_>
          ::_M_realloc_insert<Assimp::SkeletonMeshBuilder::Face>(local_d0,iVar54,(Face *)&local_148)
          ;
        }
        else {
          (iVar54._M_current)->mIndices[2] = (uint)local_148.z;
          (iVar54._M_current)->mIndices[0] = (int)fVar59 + 9;
          (iVar54._M_current)->mIndices[1] = (int)fVar59 + 10;
          ppFVar2 = &(this->mFaces).
                     super__Vector_base<Assimp::SkeletonMeshBuilder::Face,_std::allocator<Assimp::SkeletonMeshBuilder::Face>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
          *ppFVar2 = *ppFVar2 + 1;
        }
        uVar45 = pNode->mNumChildren;
      }
      uVar55 = uVar55 + 1;
    } while (uVar55 < uVar45);
  }
  uVar55 = ((long)(this->mVertices).
                  super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl
                  .super__Vector_impl_data._M_finish -
            (long)(this->mVertices).
                  super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl
                  .super__Vector_impl_data._M_start >> 2) * -0x5555555555555555 - local_80;
  fVar59 = (float)uVar55;
  if (fVar59 != 0.0) {
    paVar46 = (aiNode *)operator_new(0x460);
    (paVar46->mName).length = 0;
    (paVar46->mName).data[0] = '\0';
    memset((paVar46->mName).data + 1,0x1b,0x3ff);
    (paVar46->mTransformation).a1 = 0.0;
    *(aiVertexWeight **)&(paVar46->mTransformation).b2 = (aiVertexWeight *)0x0;
    ((aiMatrix4x4 *)&(paVar46->mTransformation).b4)->a1 = 1.0;
    (paVar46->mTransformation).c1 = 0.0;
    (paVar46->mTransformation).c2 = 0.0;
    (paVar46->mTransformation).c3 = 0.0;
    (paVar46->mTransformation).c4 = 0.0;
    (paVar46->mTransformation).d1 = 1.0;
    (paVar46->mTransformation).d2 = 0.0;
    (paVar46->mTransformation).d3 = 0.0;
    (paVar46->mTransformation).d4 = 0.0;
    *(float *)&paVar46->field_0x444 = 0.0;
    *(float *)&paVar46->mParent = 1.0;
    *(undefined8 *)((long)&paVar46->mParent + 4) = 0;
    *(undefined8 *)&paVar46->field_0x454 = 0;
    *(float *)((long)&paVar46->mChildren + 4) = 1.0;
    __position._M_current =
         (this->mBones).super__Vector_base<aiBone_*,_std::allocator<aiBone_*>_>._M_impl.
         super__Vector_impl_data._M_finish;
    local_148._0_8_ = paVar46;
    if (__position._M_current ==
        (this->mBones).super__Vector_base<aiBone_*,_std::allocator<aiBone_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<aiBone*,std::allocator<aiBone*>>::_M_realloc_insert<aiBone*const&>
                ((vector<aiBone*,std::allocator<aiBone*>> *)&this->mBones,__position,
                 (aiBone **)&local_148);
    }
    else {
      *__position._M_current = (aiBone *)paVar46;
      pppaVar3 = &(this->mBones).super__Vector_base<aiBone_*,_std::allocator<aiBone_*>_>._M_impl.
                  super__Vector_impl_data._M_finish;
      *pppaVar3 = *pppaVar3 + 1;
    }
    uVar32 = local_148._0_8_;
    if ((aiNode *)local_148._0_8_ != pNode) {
      uVar45 = (pNode->mName).length;
      ((aiString *)local_148._0_8_)->length = uVar45;
      memcpy(((aiString *)local_148._0_8_)->data,(pNode->mName).data,(ulong)uVar45);
      ((aiString *)uVar32)->data[uVar45] = '\0';
    }
    uVar28 = (pNode->mTransformation).a1;
    uVar29 = (pNode->mTransformation).a2;
    uVar30 = (pNode->mTransformation).a3;
    uVar31 = (pNode->mTransformation).a4;
    local_138._16_4_ = (pNode->mTransformation).b1;
    local_138._20_4_ = (pNode->mTransformation).b2;
    local_138._24_4_ = (pNode->mTransformation).b3;
    local_138._28_4_ = (pNode->mTransformation).b4;
    local_138._32_4_ = (pNode->mTransformation).c1;
    local_138._36_4_ = (pNode->mTransformation).c2;
    local_138._40_4_ = (pNode->mTransformation).c3;
    local_138._44_4_ = (pNode->mTransformation).c4;
    local_138._48_4_ = (pNode->mTransformation).d1;
    local_138._52_4_ = (pNode->mTransformation).d2;
    ppaStack_100._0_4_ = (pNode->mTransformation).d3;
    ppaStack_100._4_4_ = (pNode->mTransformation).d4;
    local_138._0_4_ = uVar28;
    local_138._4_4_ = uVar29;
    local_138._8_4_ = uVar30;
    local_138._12_4_ = uVar31;
    paVar47 = aiMatrix4x4t<float>::Inverse((aiMatrix4x4t<float> *)local_138);
    fVar63 = paVar47->a2;
    fVar56 = paVar47->a3;
    fVar64 = paVar47->a4;
    fVar65 = paVar47->b1;
    fVar57 = paVar47->b2;
    fVar58 = paVar47->b3;
    fVar66 = paVar47->b4;
    fVar67 = paVar47->c1;
    fVar8 = paVar47->c2;
    paVar46 = *(aiNode **)&paVar47->c3;
    uVar32 = *(undefined8 *)&paVar47->d1;
    ppaVar33 = *(aiNode ***)&paVar47->d3;
    ((aiMatrix4x4 *)(local_148._0_8_ + 0x404))->b4 = paVar47->a1;
    ((aiMatrix4x4 *)(local_148._0_8_ + 0x404))->c1 = fVar63;
    ((aiMatrix4x4 *)(local_148._0_8_ + 0x404))->c2 = fVar56;
    ((aiMatrix4x4 *)(local_148._0_8_ + 0x404))->c3 = fVar64;
    ((aiMatrix4x4 *)(local_148._0_8_ + 0x404))->c4 = fVar65;
    ((aiMatrix4x4 *)(local_148._0_8_ + 0x404))->d1 = fVar57;
    ((aiMatrix4x4 *)(local_148._0_8_ + 0x404))->d2 = fVar58;
    ((aiMatrix4x4 *)(local_148._0_8_ + 0x404))->d3 = fVar66;
    ((aiMatrix4x4 *)(local_148._0_8_ + 0x404))->d4 = fVar67;
    ((aiMatrix4x4 *)(local_148._0_8_ + 0x404))[1].a1 = fVar8;
    *(aiNode **)(local_148._0_8_ + 0x448) = paVar46;
    *(undefined8 *)(local_148._0_8_ + 0x450) = uVar32;
    *(aiNode ***)(local_148._0_8_ + 0x458) = ppaVar33;
    local_e8._0_8_ = pNode;
    paVar46 = pNode->mParent;
    if (paVar46 != (aiNode *)0x0) {
      do {
        uVar34 = (paVar46->mTransformation).a1;
        uVar35 = (paVar46->mTransformation).a2;
        uVar36 = (paVar46->mTransformation).a3;
        uVar37 = (paVar46->mTransformation).a4;
        local_138._16_4_ = (paVar46->mTransformation).b1;
        local_138._20_4_ = (paVar46->mTransformation).b2;
        local_138._24_4_ = (paVar46->mTransformation).b3;
        local_138._28_4_ = (paVar46->mTransformation).b4;
        local_138._32_4_ = (paVar46->mTransformation).c1;
        local_138._36_4_ = (paVar46->mTransformation).c2;
        local_138._40_4_ = (paVar46->mTransformation).c3;
        local_138._44_4_ = (paVar46->mTransformation).c4;
        local_138._48_4_ = (paVar46->mTransformation).d1;
        local_138._52_4_ = (paVar46->mTransformation).d2;
        ppaStack_100._0_4_ = (paVar46->mTransformation).d3;
        ppaStack_100._4_4_ = (paVar46->mTransformation).d4;
        local_138._0_4_ = uVar34;
        local_138._4_4_ = uVar35;
        local_138._8_4_ = uVar36;
        local_138._12_4_ = uVar37;
        paVar47 = aiMatrix4x4t<float>::Inverse((aiMatrix4x4t<float> *)local_138);
        fVar65 = paVar47->a1;
        fVar57 = paVar47->a2;
        fVar58 = paVar47->a3;
        fVar66 = paVar47->a4;
        fVar67 = paVar47->b1;
        fVar8 = paVar47->b2;
        fVar9 = paVar47->b3;
        fVar10 = paVar47->b4;
        fVar5 = paVar47->c1;
        fVar6 = paVar47->c2;
        fVar7 = paVar47->c3;
        fVar11 = paVar47->c4;
        fVar12 = paVar47->d1;
        paVar4 = (aiMatrix4x4 *)&((aiMatrix4x4 *)(local_148._0_8_ + 0x404))->b4;
        fVar13 = ((aiMatrix4x4 *)(local_148._0_8_ + 0x404))->c1;
        fVar14 = ((aiMatrix4x4 *)(local_148._0_8_ + 0x404))->c2;
        uVar42 = paVar4->a1;
        uVar43 = paVar4->a2;
        uVar44 = paVar4->a3;
        fVar15 = ((aiMatrix4x4 *)(local_148._0_8_ + 0x404))->c3;
        local_f8._0_4_ = paVar4->a1;
        local_f8._4_4_ = paVar4->a2;
        fStack_f0 = paVar4->a3;
        fStack_ec = paVar4->a4;
        fVar16 = ((aiMatrix4x4 *)(local_148._0_8_ + 0x404))->c4;
        fVar17 = ((aiMatrix4x4 *)(local_148._0_8_ + 0x404))->d1;
        fVar18 = ((aiMatrix4x4 *)(local_148._0_8_ + 0x404))->d2;
        fVar19 = ((aiMatrix4x4 *)(local_148._0_8_ + 0x404))->d3;
        fVar20 = ((aiMatrix4x4 *)(local_148._0_8_ + 0x404))->d4;
        fVar21 = *(float *)(local_148._0_8_ + 0x444);
        fVar22 = *(float *)(local_148._0_8_ + 0x448);
        fVar23 = *(float *)((long)(local_148._0_8_ + 0x448) + 4);
        fVar24 = *(float *)(local_148._0_8_ + 0x450);
        fVar25 = *(float *)(local_148._0_8_ + 0x454);
        fVar26 = *(float *)(local_148._0_8_ + 0x458);
        fVar27 = *(float *)((long)(local_148._0_8_ + 0x458) + 4);
        fVar63 = paVar47->d2;
        fVar56 = paVar47->d3;
        fVar64 = paVar47->d4;
        ((aiMatrix4x4 *)&((aiMatrix4x4 *)(local_148._0_8_ + 0x404))->b4)->a1 =
             fVar66 * fVar24 + fVar58 * fVar20 + fVar65 * paVar4->a1 + fVar57 * fVar16;
        ((aiMatrix4x4 *)(local_148._0_8_ + 0x404))->c1 =
             fVar66 * fVar25 + fVar58 * fVar21 + fVar65 * fVar13 + fVar57 * fVar17;
        ((aiMatrix4x4 *)(local_148._0_8_ + 0x404))->c2 =
             fVar66 * fVar26 + fVar58 * fVar22 + fVar65 * fVar14 + fVar57 * fVar18;
        ((aiMatrix4x4 *)(local_148._0_8_ + 0x404))->c3 =
             fVar66 * fVar27 + fVar58 * fVar23 + fVar65 * fVar15 + fVar57 * fVar19;
        ((aiMatrix4x4 *)(local_148._0_8_ + 0x404))->c4 =
             fVar10 * fVar24 + fVar9 * fVar20 + fVar67 * (float)uVar42 + fVar8 * fVar16;
        ((aiMatrix4x4 *)(local_148._0_8_ + 0x404))->d1 =
             fVar10 * fVar25 + fVar9 * fVar21 + fVar67 * (float)uVar43 + fVar8 * fVar17;
        ((aiMatrix4x4 *)(local_148._0_8_ + 0x404))->d2 =
             fVar10 * fVar26 + fVar9 * fVar22 + fVar67 * (float)uVar44 + fVar8 * fVar18;
        ((aiMatrix4x4 *)(local_148._0_8_ + 0x404))->d3 =
             fVar10 * fVar27 + fVar9 * fVar23 + fVar67 * fVar15 + fVar8 * fVar19;
        ((aiMatrix4x4 *)(local_148._0_8_ + 0x404))->d4 =
             fVar11 * fVar24 + fVar7 * fVar20 + fVar5 * (float)uVar42 + fVar6 * fVar16;
        *(float *)(local_148._0_8_ + 0x444) =
             fVar11 * fVar25 + fVar7 * fVar21 + fVar5 * (float)uVar43 + fVar6 * fVar17;
        *(float *)(local_148._0_8_ + 0x448) =
             fVar11 * fVar26 + fVar7 * fVar22 + fVar5 * (float)uVar44 + fVar6 * fVar18;
        *(float *)((long)(local_148._0_8_ + 0x448) + 4) =
             fVar11 * fVar27 + fVar7 * fVar23 + fVar5 * fVar15 + fVar6 * fVar19;
        *(float *)(local_148._0_8_ + 0x450) =
             fVar64 * fVar24 + fVar56 * fVar20 + fVar12 * (float)uVar42 + fVar63 * fVar16;
        *(float *)(local_148._0_8_ + 0x454) =
             fVar64 * fVar25 + fVar56 * fVar21 + fVar12 * (float)uVar43 + fVar63 * fVar17;
        *(float *)(local_148._0_8_ + 0x458) =
             fVar64 * fVar26 + fVar56 * fVar22 + fVar12 * (float)uVar44 + fVar63 * fVar18;
        *(float *)((long)(local_148._0_8_ + 0x458) + 4) =
             fVar64 * fVar27 + fVar56 * fVar23 + fVar12 * fVar15 + fVar63 * fVar19;
        paVar46 = paVar46->mParent;
      } while (paVar46 != (aiNode *)0x0);
    }
    uVar32 = local_148._0_8_;
    ((aiMatrix4x4 *)(local_148._0_8_ + 0x404))->a1 = fVar59;
    uVar55 = uVar55 & 0xffffffff;
    uVar50 = uVar55 * 8;
    paVar48 = (aiVertexWeight *)operator_new__(uVar50);
    uVar51 = 0;
    memset(paVar48,0,uVar50);
    uVar50 = local_80;
    *(aiVertexWeight **)&((aiMatrix4x4 *)(uVar32 + 0x404))->b2 = paVar48;
    do {
      uVar45 = (uint)local_80;
      paVar48 = *(aiVertexWeight **)&((aiMatrix4x4 *)(local_148._0_8_ + 0x404))->b2;
      paVar48[uVar51].mVertexId = uVar45 + (int)uVar51;
      paVar48[uVar51].mWeight = 1.0;
      uVar51 = uVar51 + 1;
    } while (uVar55 != uVar51);
    uVar38 = ((aiMatrix4x4 *)(local_148._0_8_ + 0x404))->b4;
    uVar39 = ((aiMatrix4x4 *)(local_148._0_8_ + 0x404))->c1;
    uVar40 = ((aiMatrix4x4 *)(local_148._0_8_ + 0x404))->c2;
    uVar41 = ((aiMatrix4x4 *)(local_148._0_8_ + 0x404))->c3;
    local_138._16_4_ = ((aiMatrix4x4 *)(local_148._0_8_ + 0x404))->c4;
    local_138._20_4_ = ((aiMatrix4x4 *)(local_148._0_8_ + 0x404))->d1;
    local_138._24_4_ = ((aiMatrix4x4 *)(local_148._0_8_ + 0x404))->d2;
    local_138._28_4_ = ((aiMatrix4x4 *)(local_148._0_8_ + 0x404))->d3;
    local_138._32_4_ = ((aiMatrix4x4 *)(local_148._0_8_ + 0x404))->d4;
    local_138._36_4_ = ((aiMatrix4x4 *)(local_148._0_8_ + 0x404))[1].a1;
    local_138._40_8_ = *(aiNode **)(local_148._0_8_ + 0x448);
    local_138._48_8_ = *(undefined8 *)(local_148._0_8_ + 0x450);
    ppaStack_100 = *(aiNode ***)(local_148._0_8_ + 0x458);
    local_138._0_4_ = uVar38;
    local_138._4_4_ = uVar39;
    local_138._8_4_ = uVar40;
    local_138._12_4_ = uVar41;
    paVar47 = aiMatrix4x4t<float>::Inverse((aiMatrix4x4t<float> *)local_138);
    uVar50 = uVar50 & 0xffffffff;
    paVar49 = (this->mVertices).
              super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
              super__Vector_impl_data._M_start;
    uVar55 = ((long)(this->mVertices).
                    super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                    _M_impl.super__Vector_impl_data._M_finish - (long)paVar49 >> 2) *
             -0x5555555555555555;
    pNode = (aiNode *)local_e8._0_8_;
    if (uVar50 <= uVar55 && uVar55 - uVar50 != 0) {
      fVar67 = paVar47->a1;
      fVar8 = paVar47->a2;
      fVar9 = paVar47->a3;
      fVar10 = paVar47->a4;
      fVar59 = paVar47->b1;
      fVar63 = paVar47->b2;
      fVar56 = paVar47->b3;
      fVar64 = paVar47->b4;
      fVar65 = paVar47->c1;
      fVar57 = paVar47->c2;
      fVar58 = paVar47->c3;
      fVar66 = paVar47->c4;
      do {
        uVar45 = uVar45 + 1;
        fVar5 = paVar49[uVar50].x;
        fVar6 = paVar49[uVar50].y;
        fVar7 = paVar49[uVar50].z;
        paVar49[uVar50].x = fVar7 * fVar9 + fVar5 * fVar67 + fVar6 * fVar8 + fVar10;
        paVar49[uVar50].y = fVar7 * fVar56 + fVar5 * fVar59 + fVar6 * fVar63 + fVar64;
        paVar49[uVar50].z = fVar65 * fVar5 + fVar57 * fVar6 + fVar58 * fVar7 + fVar66;
        uVar50 = (ulong)uVar45;
        paVar49 = (this->mVertices).
                  super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl
                  .super__Vector_impl_data._M_start;
        uVar55 = ((long)(this->mVertices).
                        super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                        _M_impl.super__Vector_impl_data._M_finish - (long)paVar49 >> 2) *
                 -0x5555555555555555;
      } while (uVar50 <= uVar55 && uVar55 - uVar50 != 0);
    }
  }
  if (pNode->mNumChildren != 0) {
    uVar55 = 0;
    do {
      CreateGeometry(this,pNode->mChildren[uVar55]);
      uVar55 = uVar55 + 1;
    } while (uVar55 < pNode->mNumChildren);
  }
  return;
}

Assistant:

void SkeletonMeshBuilder::CreateGeometry( const aiNode* pNode)
{
    // add a joint entry for the node.
    const unsigned int vertexStartIndex = static_cast<unsigned int>(mVertices.size());

    // now build the geometry.
    if( pNode->mNumChildren > 0 && !mKnobsOnly)
    {
        // If the node has children, we build little pointers to each of them
        for( unsigned int a = 0; a < pNode->mNumChildren; a++)
        {
            // find a suitable coordinate system
            const aiMatrix4x4& childTransform = pNode->mChildren[a]->mTransformation;
            aiVector3D childpos( childTransform.a4, childTransform.b4, childTransform.c4);
            ai_real distanceToChild = childpos.Length();
            if( distanceToChild < 0.0001)
                continue;
            aiVector3D up = aiVector3D( childpos).Normalize();

            aiVector3D orth( 1.0, 0.0, 0.0);
            if( std::fabs( orth * up) > 0.99)
                orth.Set( 0.0, 1.0, 0.0);

            aiVector3D front = (up ^ orth).Normalize();
            aiVector3D side = (front ^ up).Normalize();

            unsigned int localVertexStart = static_cast<unsigned int>(mVertices.size());
            mVertices.push_back( -front * distanceToChild * (ai_real)0.1);
            mVertices.push_back( childpos);
            mVertices.push_back( -side * distanceToChild * (ai_real)0.1);
            mVertices.push_back( -side * distanceToChild * (ai_real)0.1);
            mVertices.push_back( childpos);
            mVertices.push_back( front * distanceToChild * (ai_real)0.1);
            mVertices.push_back( front * distanceToChild * (ai_real)0.1);
            mVertices.push_back( childpos);
            mVertices.push_back( side * distanceToChild * (ai_real)0.1);
            mVertices.push_back( side * distanceToChild * (ai_real)0.1);
            mVertices.push_back( childpos);
            mVertices.push_back( -front * distanceToChild * (ai_real)0.1);

            mFaces.push_back( Face( localVertexStart + 0, localVertexStart + 1, localVertexStart + 2));
            mFaces.push_back( Face( localVertexStart + 3, localVertexStart + 4, localVertexStart + 5));
            mFaces.push_back( Face( localVertexStart + 6, localVertexStart + 7, localVertexStart + 8));
            mFaces.push_back( Face( localVertexStart + 9, localVertexStart + 10, localVertexStart + 11));
        }
    }
    else
    {
        // if the node has no children, it's an end node. Put a little knob there instead
        aiVector3D ownpos( pNode->mTransformation.a4, pNode->mTransformation.b4, pNode->mTransformation.c4);
        ai_real sizeEstimate = ownpos.Length() * ai_real( 0.18 );

        mVertices.push_back( aiVector3D( -sizeEstimate, 0.0, 0.0));
        mVertices.push_back( aiVector3D( 0.0, sizeEstimate, 0.0));
        mVertices.push_back( aiVector3D( 0.0, 0.0, -sizeEstimate));
        mVertices.push_back( aiVector3D( 0.0, sizeEstimate, 0.0));
        mVertices.push_back( aiVector3D( sizeEstimate, 0.0, 0.0));
        mVertices.push_back( aiVector3D( 0.0, 0.0, -sizeEstimate));
        mVertices.push_back( aiVector3D( sizeEstimate, 0.0, 0.0));
        mVertices.push_back( aiVector3D( 0.0, -sizeEstimate, 0.0));
        mVertices.push_back( aiVector3D( 0.0, 0.0, -sizeEstimate));
        mVertices.push_back( aiVector3D( 0.0, -sizeEstimate, 0.0));
        mVertices.push_back( aiVector3D( -sizeEstimate, 0.0, 0.0));
        mVertices.push_back( aiVector3D( 0.0, 0.0, -sizeEstimate));

        mVertices.push_back( aiVector3D( -sizeEstimate, 0.0, 0.0));
        mVertices.push_back( aiVector3D( 0.0, 0.0, sizeEstimate));
        mVertices.push_back( aiVector3D( 0.0, sizeEstimate, 0.0));
        mVertices.push_back( aiVector3D( 0.0, sizeEstimate, 0.0));
        mVertices.push_back( aiVector3D( 0.0, 0.0, sizeEstimate));
        mVertices.push_back( aiVector3D( sizeEstimate, 0.0, 0.0));
        mVertices.push_back( aiVector3D( sizeEstimate, 0.0, 0.0));
        mVertices.push_back( aiVector3D( 0.0, 0.0, sizeEstimate));
        mVertices.push_back( aiVector3D( 0.0, -sizeEstimate, 0.0));
        mVertices.push_back( aiVector3D( 0.0, -sizeEstimate, 0.0));
        mVertices.push_back( aiVector3D( 0.0, 0.0, sizeEstimate));
        mVertices.push_back( aiVector3D( -sizeEstimate, 0.0, 0.0));

        mFaces.push_back( Face( vertexStartIndex + 0, vertexStartIndex + 1, vertexStartIndex + 2));
        mFaces.push_back( Face( vertexStartIndex + 3, vertexStartIndex + 4, vertexStartIndex + 5));
        mFaces.push_back( Face( vertexStartIndex + 6, vertexStartIndex + 7, vertexStartIndex + 8));
        mFaces.push_back( Face( vertexStartIndex + 9, vertexStartIndex + 10, vertexStartIndex + 11));
        mFaces.push_back( Face( vertexStartIndex + 12, vertexStartIndex + 13, vertexStartIndex + 14));
        mFaces.push_back( Face( vertexStartIndex + 15, vertexStartIndex + 16, vertexStartIndex + 17));
        mFaces.push_back( Face( vertexStartIndex + 18, vertexStartIndex + 19, vertexStartIndex + 20));
        mFaces.push_back( Face( vertexStartIndex + 21, vertexStartIndex + 22, vertexStartIndex + 23));
    }

    unsigned int numVertices = static_cast<unsigned int>(mVertices.size() - vertexStartIndex);
    if( numVertices > 0)
    {
        // create a bone affecting all the newly created vertices
        aiBone* bone = new aiBone;
        mBones.push_back( bone);
        bone->mName = pNode->mName;

        // calculate the bone offset matrix by concatenating the inverse transformations of all parents
        bone->mOffsetMatrix = aiMatrix4x4( pNode->mTransformation).Inverse();
        for( aiNode* parent = pNode->mParent; parent != NULL; parent = parent->mParent)
            bone->mOffsetMatrix = aiMatrix4x4( parent->mTransformation).Inverse() * bone->mOffsetMatrix;

        // add all the vertices to the bone's influences
        bone->mNumWeights = numVertices;
        bone->mWeights = new aiVertexWeight[numVertices];
        for( unsigned int a = 0; a < numVertices; a++)
            bone->mWeights[a] = aiVertexWeight( vertexStartIndex + a, 1.0);

        // HACK: (thom) transform all vertices to the bone's local space. Should be done before adding
        // them to the array, but I'm tired now and I'm annoyed.
        aiMatrix4x4 boneToMeshTransform = aiMatrix4x4( bone->mOffsetMatrix).Inverse();
        for( unsigned int a = vertexStartIndex; a < mVertices.size(); a++)
            mVertices[a] = boneToMeshTransform * mVertices[a];
    }

    // and finally recurse into the children list
    for( unsigned int a = 0; a < pNode->mNumChildren; a++)
        CreateGeometry( pNode->mChildren[a]);
}